

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O2

void adios2::helper::HandshakeWriter
               (Comm *comm,size_t *appID,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *fullAddresses,string *name,string *engineName,int basePort,int channelsPerRank,
               int maxRanksPerNode,int maxAppsPerNode)

{
  int iVar1;
  uint uVar2;
  unsigned_long uVar3;
  reference val;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  vector<char,_std::allocator<char>_> localAddressesChar;
  json globalAddressesJson;
  json localAddressesJson;
  vector<char,_std::allocator<char>_> globalAddressesChar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ips;
  string globalLockFilename;
  _Any_data local_d38;
  undefined8 local_d28;
  undefined8 uStack_d20;
  string ip;
  string engineLockFilename;
  string globalFilename;
  string engineFilename;
  FileFStream lockCheck;
  FileFStream numWrite;
  FileFStream lockWrite;
  string localAddressesStr;
  
  iVar1 = Comm::Rank(comm);
  uVar2 = Comm::Size(comm);
  std::__cxx11::string::string((string *)&globalFilename,".socket",(allocator *)&lockCheck);
  std::__cxx11::string::string((string *)&globalLockFilename,".socket.lock",(allocator *)&lockCheck)
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lockCheck,
                 name,".");
  std::operator+(&engineFilename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lockCheck,
                 engineName);
  std::__cxx11::string::~string((string *)&lockCheck);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lockWrite,
                 name,".");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lockCheck,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lockWrite,
                 engineName);
  std::operator+(&engineLockFilename,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lockCheck,
                 ".lock");
  std::__cxx11::string::~string((string *)&lockCheck);
  std::__cxx11::string::~string((string *)&lockWrite);
  AvailableIpAddresses_abi_cxx11_();
  std::__cxx11::string::string((string *)&ip,"127.0.0.1",(allocator *)&lockCheck);
  if (ips.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      ips.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)&ip);
  }
  if (iVar1 != 0) {
    uVar4 = 0;
    uVar3 = Comm::BroadcastValue<unsigned_long>(comm,appID,0);
    *appID = uVar3;
    lVar5 = (long)(iVar1 % 1000) * (long)channelsPerRank + (long)basePort;
    if (0 < channelsPerRank) {
      uVar4 = (ulong)(uint)channelsPerRank;
    }
    while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numWrite,
                     "tcp://",&ip);
      std::operator+(&localAddressesStr,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&numWrite,
                     ":");
      std::__cxx11::to_string((string *)&localAddressesChar,*appID * 100 + lVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lockWrite
                     ,&localAddressesStr,(string *)&localAddressesChar);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lockCheck
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &lockWrite,"");
      std::__cxx11::string::~string((string *)&lockWrite);
      std::__cxx11::string::~string((string *)&localAddressesChar);
      std::__cxx11::string::~string((string *)&localAddressesStr);
      std::__cxx11::string::~string((string *)&numWrite);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(fullAddresses,(value_type *)&lockCheck);
      std::__cxx11::string::~string((string *)&lockCheck);
      lVar5 = lVar5 + 1;
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::
    basic_json<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (&localAddressesJson,fullAddresses);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(&localAddressesStr,&localAddressesJson,-1,' ',false,strict);
    lockCheck.super_Transport._vptr_Transport =
         (_func_int **)((ulong)lockCheck.super_Transport._vptr_Transport & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::vector
              (&localAddressesChar,(long)(channelsPerRank << 6),(value_type *)&lockCheck,
               (allocator_type *)&lockWrite);
    memcpy(localAddressesChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,localAddressesStr._M_dataplus._M_p,
           localAddressesStr._M_string_length);
    lVar5 = (long)channelsPerRank * 0x40;
    lockCheck.super_Transport._vptr_Transport =
         (_func_int **)((ulong)lockCheck.super_Transport._vptr_Transport & 0xffffffffffffff00);
    std::vector<char,_std::allocator<char>_>::vector
              (&globalAddressesChar,(int)uVar2 * lVar5,(value_type *)&lockCheck,
               (allocator_type *)&lockWrite);
    Comm::GatherArrays<char>
              (comm,localAddressesChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,(long)(channelsPerRank << 6),
               globalAddressesChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,0);
    if (iVar1 == 0) {
      uVar6 = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&globalAddressesJson,(nullptr_t)0x0);
      uVar4 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar4 = uVar6;
      }
      for (; uVar6 != uVar4; uVar6 = uVar6 + 1) {
        lockCheck.super_Transport._vptr_Transport =
             (_func_int **)
             (globalAddressesChar.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + lVar5 * uVar6);
        local_d38._M_unused._M_object = (void *)0x0;
        local_d38._8_8_ = 0;
        local_d28 = 0;
        uStack_d20 = 0;
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::parse<char*>((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)&numWrite,(char **)&lockCheck,(parser_callback_t *)&local_d38,true,false);
        std::_Function_base::~_Function_base((_Function_base *)&local_d38);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::begin((iterator *)&lockCheck,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&numWrite);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::end((iterator *)&lockWrite,
              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *)&numWrite);
        while( true ) {
          bVar7 = nlohmann::detail::
                  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator!=<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)&lockCheck,
                             (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)&lockWrite);
          if (!bVar7) break;
          val = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&lockCheck);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::push_back(&globalAddressesJson,val);
          nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)&lockCheck);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)&numWrite);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::dump((string_t *)&numWrite,&globalAddressesJson,-1,' ',false,strict);
      transport::FileFStream::FileFStream(&lockCheck,comm);
      transport::FileFStream::Open(&lockCheck,&engineLockFilename,Write,false,false);
      transport::FileFStream::FileFStream(&lockWrite,comm);
      transport::FileFStream::Open(&lockWrite,&engineFilename,Write,false,false);
      transport::FileFStream::Write
                (&lockWrite,(char *)numWrite.super_Transport._vptr_Transport,
                 (size_t)numWrite.super_Transport.m_Type._M_dataplus._M_p,0xffffffffffffffff);
      transport::FileFStream::Close(&lockWrite);
      transport::FileFStream::Close(&lockCheck);
      remove(engineLockFilename._M_dataplus._M_p);
      transport::FileFStream::~FileFStream(&lockWrite);
      transport::FileFStream::~FileFStream(&lockCheck);
      std::__cxx11::string::~string((string *)&numWrite);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&globalAddressesJson);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&globalAddressesChar.super__Vector_base<char,_std::allocator<char>_>);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&localAddressesChar.super__Vector_base<char,_std::allocator<char>_>);
    std::__cxx11::string::~string((string *)&localAddressesStr);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&localAddressesJson);
    std::__cxx11::string::~string((string *)&ip);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ips);
    std::__cxx11::string::~string((string *)&engineLockFilename);
    std::__cxx11::string::~string((string *)&engineFilename);
    std::__cxx11::string::~string((string *)&globalLockFilename);
    std::__cxx11::string::~string((string *)&globalFilename);
    return;
  }
  transport::FileFStream::FileFStream(&lockCheck,comm);
  do {
    transport::FileFStream::Open(&lockCheck,&globalLockFilename,Read,false,false);
    transport::FileFStream::Close(&lockCheck);
  } while( true );
}

Assistant:

void HandshakeWriter(Comm const &comm, size_t &appID, std::vector<std::string> &fullAddresses,
                     const std::string &name, const std::string &engineName, const int basePort,
                     const int channelsPerRank, const int maxRanksPerNode, const int maxAppsPerNode)
{

    int mpiRank = comm.Rank();
    int mpiSize = comm.Size();

    const std::string globalFilename = ".socket";
    const std::string globalLockFilename = ".socket.lock";

    const std::string engineFilename = name + "." + engineName;
    const std::string engineLockFilename = name + "." + engineName + ".lock";

    // Get IP address
    auto ips = helper::AvailableIpAddresses();
    std::string ip = "127.0.0.1";
    if (ips.empty() == false)
    {
        ip = ips[0];
    }

    // Check total number of writer apps
    if (mpiRank == 0)
    {
        transport::FileFStream lockCheck(comm);
        while (true)
        {
            try
            {
                lockCheck.Open(globalLockFilename, Mode::Read);
                lockCheck.Close();
            }
            catch (...)
            {
                break;
            }
        }
        transport::FileFStream lockWrite(comm);
        lockWrite.Open(globalLockFilename, Mode::Write);

        transport::FileFStream numRead(comm);
        try
        {
            numRead.Open(globalFilename, Mode::Read);
            auto size = numRead.GetSize();
            std::vector<char> numAppsChar(size);
            numRead.Read(numAppsChar.data(), numAppsChar.size());
            appID = 1 + stoi(std::string(numAppsChar.begin(), numAppsChar.end()));
            numRead.Close();
        }
        catch (...)
        {
        }
        transport::FileFStream numWrite(comm);
        numWrite.Open(globalFilename, Mode::Write);
        std::string numAppsString = std::to_string(appID);
        numWrite.Write(numAppsString.data(), numAppsString.size());
        numWrite.Close();

        lockWrite.Close();
        remove(globalLockFilename.c_str());
    }

    appID = comm.BroadcastValue(appID);

    // Make full addresses
    for (int i = 0; i < channelsPerRank; ++i)
    {
        std::string addr =
            "tcp://" + ip + ":" +
            std::to_string(basePort + (100 * appID) +
                           (mpiRank % 1000) * static_cast<unsigned long>(channelsPerRank) + i) +
            "\0";
        fullAddresses.push_back(addr);
    }
    nlohmann::json localAddressesJson = fullAddresses;
    std::string localAddressesStr = localAddressesJson.dump();
    std::vector<char> localAddressesChar(64 * channelsPerRank, '\0');
    std::memcpy(localAddressesChar.data(), localAddressesStr.c_str(), localAddressesStr.size());
    std::vector<char> globalAddressesChar(static_cast<size_t>(64) * channelsPerRank * mpiSize,
                                          '\0');
    comm.GatherArrays(localAddressesChar.data(), 64 * channelsPerRank, globalAddressesChar.data());

    // Writing handshake file
    if (mpiRank == 0)
    {
        nlohmann::json globalAddressesJson;
        for (int i = 0; i < mpiSize; ++i)
        {
            auto j = nlohmann::json::parse(
                &globalAddressesChar[static_cast<size_t>(i) * static_cast<size_t>(64) *
                                     static_cast<size_t>(channelsPerRank)]);
            for (auto &i : j)
            {
                globalAddressesJson.push_back(i);
            }
        }
        std::string globalAddressesStr = globalAddressesJson.dump();
        transport::FileFStream lockstream(comm);
        lockstream.Open(engineLockFilename, Mode::Write);
        transport::FileFStream ipstream(comm);
        ipstream.Open(engineFilename, Mode::Write);
        ipstream.Write(globalAddressesStr.data(), globalAddressesStr.size());
        ipstream.Close();
        lockstream.Close();
        remove(engineLockFilename.c_str());
    }
}